

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmGeneratorTarget *target,char *filename)

{
  pointer pbVar1;
  cmMakefile *this_00;
  string *psVar2;
  ostream *poVar3;
  string *file;
  pointer remote_path;
  string local_308;
  string cleanfile;
  string fc;
  string local_298;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_278;
  string cleanfilePath;
  string currentBinDir;
  ofstream fout;
  
  local_278 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&currentBinDir,(string *)psVar2);
  std::__cxx11::string::string((string *)&cleanfile,(string *)&currentBinDir);
  std::__cxx11::string::append((char *)&cleanfile);
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
            (&fout,this,target);
  std::__cxx11::string::append((string *)&cleanfile);
  std::__cxx11::string::~string((string *)&fout);
  std::__cxx11::string::append((char *)&cleanfile);
  if (filename != (char *)0x0) {
    std::__cxx11::string::append((char *)&cleanfile);
    std::__cxx11::string::append((char *)&cleanfile);
  }
  std::__cxx11::string::append((char *)&cleanfile);
  cmsys::SystemTools::CollapseFullPath(&cleanfilePath,&cleanfile);
  std::ofstream::ofstream(&fout,cleanfilePath._M_dataplus._M_p,_S_out);
  if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
      != 0) {
    std::operator+(&fc,"Could not create ",&cleanfilePath);
    cmSystemTools::Error(&fc);
    std::__cxx11::string::~string((string *)&fc);
  }
  if ((files->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (files->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"file(REMOVE_RECURSE\n"
                   );
    pbVar1 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (remote_path = (files->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; remote_path != pbVar1;
        remote_path = remote_path + 1) {
      cmLocalGenerator::MaybeConvertToRelativePath
                (&fc,(cmLocalGenerator *)this,&currentBinDir,remote_path);
      poVar3 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"  ");
      cmOutputConverter::EscapeForCMake(&local_308,&fc);
      poVar3 = std::operator<<(poVar3,(string *)&local_308);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&fc);
    }
    std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,")\n");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fc,"$(CMAKE_COMMAND) -P ",(allocator<char> *)&local_308);
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&local_298,(cmLocalGenerator *)this,psVar2,&cleanfile);
  cmOutputConverter::ConvertToOutputFormat
            (&local_308,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_298,SHELL);
  std::__cxx11::string::append((string *)&fc);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_298);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_278,&fc);
  std::__cxx11::string::~string((string *)&fc);
  if (filename == (char *)0x0) {
    fc.field_2._8_8_ = &fc._M_string_length;
    fc._M_string_length._0_4_ = 0;
    fc.field_2._M_allocated_capacity = 0;
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_298);
    psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_308);
    cmGeneratorTarget::GetLanguages
              (target,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&fc,psVar2);
    std::__cxx11::string::~string((string *)&local_308);
    poVar3 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    poVar3 = std::operator<<(poVar3,"# Per-language clean rules from dependency scanning.\n");
    poVar3 = std::operator<<(poVar3,"foreach(lang ");
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_308,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&fc," ");
    poVar3 = std::operator<<(poVar3,(string *)&local_308);
    poVar3 = std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(poVar3,"  include(");
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
              (&local_298,this,target);
    poVar3 = std::operator<<(poVar3,(string *)&local_298);
    poVar3 = std::operator<<(poVar3,"/cmake_clean_${lang}.cmake OPTIONAL)\n");
    std::operator<<(poVar3,"endforeach()\n");
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_308);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&fc);
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&cleanfilePath);
  std::__cxx11::string::~string((string *)&cleanfile);
  std::__cxx11::string::~string((string *)&currentBinDir);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCleanCommand(
  std::vector<std::string>& commands, const std::vector<std::string>& files,
  cmGeneratorTarget* target, const char* filename)
{
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = currentBinDir;
  cleanfile += "/";
  cleanfile += this->GetTargetDirectory(target);
  cleanfile += "/cmake_clean";
  if (filename) {
    cleanfile += "_";
    cleanfile += filename;
  }
  cleanfile += ".cmake";
  std::string cleanfilePath = cmSystemTools::CollapseFullPath(cleanfile);
  cmsys::ofstream fout(cleanfilePath.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not create " + cleanfilePath);
  }
  if (!files.empty()) {
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& file : files) {
      std::string fc = this->MaybeConvertToRelativePath(currentBinDir, file);
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  {
    std::string remove = "$(CMAKE_COMMAND) -P ";
    remove += this->ConvertToOutputFormat(
      this->MaybeConvertToRelativePath(this->GetCurrentBinaryDirectory(),
                                       cleanfile),
      cmOutputConverter::SHELL);
    commands.push_back(std::move(remove));
  }

  // For the main clean rule add per-language cleaning.
  if (!filename) {
    // Get the set of source languages in the target.
    std::set<std::string> languages;
    target->GetLanguages(
      languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    /* clang-format off */
    fout << "\n"
         << "# Per-language clean rules from dependency scanning.\n"
         << "foreach(lang " << cmJoin(languages, " ") << ")\n"
         << "  include(" << this->GetTargetDirectory(target)
         << "/cmake_clean_${lang}.cmake OPTIONAL)\n"
         << "endforeach()\n";
    /* clang-format on */
  }
}